

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message.cc
# Opt level: O0

void __thiscall
google::protobuf::DynamicMessage::DynamicMessage
          (DynamicMessage *this,TypeInfo *type_info,bool lock_factory)

{
  ClassData *pCVar1;
  bool lock_factory_local;
  TypeInfo *type_info_local;
  DynamicMessage *this_local;
  
  pCVar1 = internal::ClassDataFull::base(&type_info->class_data);
  Message::MessageLite(&this->super_Message,pCVar1);
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__DynamicMessage_00a19808;
  this->type_info_ = type_info;
  internal::CachedSize::CachedSize(&this->cached_byte_size_,0);
  (type_info->class_data).super_ClassData.prototype = (MessageLite *)this;
  SharedCtor(this,lock_factory);
  return;
}

Assistant:

DynamicMessage::DynamicMessage(DynamicMessageFactory::TypeInfo* type_info,
                               bool lock_factory)
    : Message(type_info->class_data.base()),
      type_info_(type_info),
      cached_byte_size_(0) {
  // The prototype in type_info has to be set before creating the prototype
  // instance on memory. e.g., message Foo { map<int32_t, Foo> a = 1; }. When
  // creating prototype for Foo, prototype of the map entry will also be
  // created, which needs the address of the prototype of Foo (the value in
  // map). To break the cyclic dependency, we have to assign the address of
  // prototype into type_info first.
  type_info->class_data.prototype = this;
  SharedCtor(lock_factory);
}